

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void neg_shift_avx2(__m256i in0,__m256i in1,__m256i *out0,__m256i *out1,__m256i *clamp_lo,
                   __m256i *clamp_hi,int shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  uint uVar7;
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  uint in_R8D;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_YMM1_H;
  undefined8 in_register_00001258;
  __m256i a1;
  __m256i a0;
  __m256i offset;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  byte local_344;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  
  local_344 = (byte)in_R8D;
  uVar7 = (1 << (local_344 & 0x1f)) >> 1;
  auVar1 = vpinsrd_avx(ZEXT416(uVar7),uVar7,1);
  auVar1 = vpinsrd_avx(auVar1,uVar7,2);
  auVar1 = vpinsrd_avx(auVar1,uVar7,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar7),uVar7,1);
  auVar2 = vpinsrd_avx(auVar2,uVar7,2);
  auVar2 = vpinsrd_avx(auVar2,uVar7,3);
  uStack_b0 = auVar2._0_8_;
  uStack_a8 = auVar2._8_8_;
  auVar5._16_8_ = uStack_b0;
  auVar5._0_16_ = auVar1;
  auVar5._24_8_ = uStack_a8;
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = in_XMM0_Qa;
  auVar3._16_8_ = in_YMM0_H;
  auVar3._24_8_ = in_register_00001218;
  auVar3 = vpaddd_avx2(auVar5,auVar3);
  auVar6._16_8_ = uStack_b0;
  auVar6._0_16_ = auVar1;
  auVar6._24_8_ = uStack_a8;
  auVar4._8_8_ = in_XMM1_Qb;
  auVar4._0_8_ = in_XMM1_Qa;
  auVar4._16_8_ = in_YMM1_H;
  auVar4._24_8_ = in_register_00001258;
  auVar5 = vpsubd_avx2(auVar6,auVar4);
  auVar3 = vpsrad_avx2(auVar3,ZEXT416(in_R8D));
  auVar4 = vpsrad_avx2(auVar5,ZEXT416(in_R8D));
  auVar3 = vpmaxsd_avx2(auVar3,*in_RDX);
  auVar5 = vpminsd_avx2(auVar3,*in_RCX);
  auVar3 = vpmaxsd_avx2(auVar4,*in_RDX);
  auVar3 = vpminsd_avx2(auVar3,*in_RCX);
  local_3a0 = auVar5._0_8_;
  uStack_398 = auVar5._8_8_;
  uStack_390 = auVar5._16_8_;
  uStack_388 = auVar5._24_8_;
  *in_RDI = local_3a0;
  in_RDI[1] = uStack_398;
  in_RDI[2] = uStack_390;
  in_RDI[3] = uStack_388;
  local_3c0 = auVar3._0_8_;
  uStack_3b8 = auVar3._8_8_;
  uStack_3b0 = auVar3._16_8_;
  uStack_3a8 = auVar3._24_8_;
  *in_RSI = local_3c0;
  in_RSI[1] = uStack_3b8;
  in_RSI[2] = uStack_3b0;
  in_RSI[3] = uStack_3a8;
  return;
}

Assistant:

static void neg_shift_avx2(const __m256i in0, const __m256i in1, __m256i *out0,
                           __m256i *out1, const __m256i *clamp_lo,
                           const __m256i *clamp_hi, int shift) {
  __m256i offset = _mm256_set1_epi32((1 << shift) >> 1);
  __m256i a0 = _mm256_add_epi32(offset, in0);
  __m256i a1 = _mm256_sub_epi32(offset, in1);

  a0 = _mm256_sra_epi32(a0, _mm_cvtsi32_si128(shift));
  a1 = _mm256_sra_epi32(a1, _mm_cvtsi32_si128(shift));

  a0 = _mm256_max_epi32(a0, *clamp_lo);
  a0 = _mm256_min_epi32(a0, *clamp_hi);
  a1 = _mm256_max_epi32(a1, *clamp_lo);
  a1 = _mm256_min_epi32(a1, *clamp_hi);

  *out0 = a0;
  *out1 = a1;
}